

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  secp256k1_scalar_verify(x);
  iVar3 = 1;
  uVar1 = 0;
  iVar2 = 0;
  do {
    if (iVar2 == -0xd) {
LAB_0010f2a4:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/scalar_low_impl.h"
              ,0xb8,"test condition failed: res != 0");
      abort();
    }
    if ((uVar1 / 0xd) * 0xd + iVar3 == 0) {
      if (iVar2 != 0) {
        *r = -iVar2;
        secp256k1_scalar_verify(r);
        return;
      }
      goto LAB_0010f2a4;
    }
    iVar2 = iVar2 + -1;
    iVar3 = iVar3 - *x;
    uVar1 = uVar1 + *x;
  } while( true );
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    uint32_t res = 0;
    SECP256K1_SCALAR_VERIFY(x);

    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1) {
            res = i;
            break;
        }
    }

    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(res != 0);
    *r = res;

    SECP256K1_SCALAR_VERIFY(r);
}